

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetValueType(JsValueRef value,JsValueType *type)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  BOOL BVar4;
  undefined8 in_RAX;
  undefined4 *puVar5;
  RecyclableObject *this;
  JsValueType typeId;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (type == (JsValueType *)0x0) {
    return JsErrorNullArgument;
  }
  local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
  local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
  local_28.hasException = true;
  DVar3 = ExceptionCheck::Save();
  local_28.__exceptionCheck.handledExceptionType = DVar3.handledExceptionType;
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)value >> 0x32 != 0 || ((ulong)value & 0xffff000000000000) == 0x1000000000000)
    goto switchD_0036c2d5_caseD_3;
    this = Js::UnsafeVarTo<Js::RecyclableObject>(value);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_0036c359;
      *puVar5 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar2) goto LAB_0036c359;
      *puVar5 = 0;
    }
    switch(typeId) {
    case JsUndefined:
    case JsNull:
      break;
    case JsNumber:
      typeId = JsBoolean;
      break;
    case JsString:
    case JsBoolean:
    case JsObject:
    case JsFunction:
      goto switchD_0036c2d5_caseD_3;
    case JsError:
      typeId = JsString;
      break;
    case JsArray:
      typeId = JsSymbol;
      break;
    case 0x1b:
      typeId = JsFunction;
      break;
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
      typeId = JsArray;
      break;
    case 0x24:
      typeId = JsError;
      break;
    default:
      if (typeId == 0x2b) {
        typeId = JsArrayBuffer;
        break;
      }
      if (typeId == 0x3a) {
        typeId = JsDataView;
        break;
      }
    case JsSymbol:
    case JsArrayBuffer:
    case JsTypedArray:
    case JsDataView:
    case JsDataView|JsNull:
    case JsDataView|JsNumber:
    case JsDataView|JsString:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1c:
    case 0x22:
    case 0x23:
      BVar4 = Js::TypedArrayBase::Is(typeId);
      typeId = JsTypedArray;
      if (BVar4 == 0) {
        typeId = JsObject;
      }
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_0036c359:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
switchD_0036c2d5_caseD_3:
    typeId = JsNumber;
  }
  *type = typeId;
  local_28.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_28);
  return JsNoError;
}

Assistant:

CHAKRA_API JsGetValueType(_In_ JsValueRef value, _Out_ JsValueType *type)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(type);

    BEGIN_JSRT_NO_EXCEPTION
    {
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(value);
        switch (typeId)
        {
        case Js::TypeIds_Undefined:
            *type = JsUndefined;
            break;
        case Js::TypeIds_Null:
            *type = JsNull;
            break;
        case Js::TypeIds_Boolean:
            *type = JsBoolean;
            break;
        case Js::TypeIds_Integer:
        case Js::TypeIds_Number:
        case Js::TypeIds_Int64Number:
        case Js::TypeIds_UInt64Number:
            *type = JsNumber;
            break;
        case Js::TypeIds_String:
            *type = JsString;
            break;
        case Js::TypeIds_Function:
            *type = JsFunction;
            break;
        case Js::TypeIds_Error:
            *type = JsError;
            break;
        case Js::TypeIds_Array:
        case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
        case Js::TypeIds_NativeFloatArray:
        case Js::TypeIds_ES5Array:
            *type = JsArray;
            break;
        case Js::TypeIds_Symbol:
            *type = JsSymbol;
            break;
        case Js::TypeIds_ArrayBuffer:
            *type = JsArrayBuffer;
            break;
        case Js::TypeIds_DataView:
            *type = JsDataView;
            break;
        default:
            if (Js::TypedArrayBase::Is(typeId))
            {
                *type = JsTypedArray;
            }
            else
            {
                *type = JsObject;
            }
            break;
        }
    }